

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

Vec_Int_t * Gia_ManFindPivots(Gia_Man_t *p,int SelectShift,int fOnlyCis,int fVerbose)

{
  int iVar1;
  uint nSize;
  ulong uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  int *piVar4;
  Vec_Int_t *p_01;
  uint *__ptr;
  int *piVar5;
  Vec_Int_t *p_02;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  int *pArray;
  
  Gia_ManCreateRefs(p);
  piVar5 = p->pRefs;
  iVar7 = p->nObjs;
  p->pRefs = (int *)0x0;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_00->pArray = piVar4;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar4 = (int *)malloc(400);
  p_01->pArray = piVar4;
  if (0 < (long)iVar7) {
    lVar9 = 0;
    do {
      iVar1 = piVar5[lVar9];
      if (1 < iVar1) {
        if (fOnlyCis != 0) {
          if (p->nObjs <= lVar9) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          if ((~*(uint *)(p->pObjs + lVar9) & 0x9fffffff) != 0) goto LAB_007153b9;
        }
        Vec_IntPush(p_00,(int)lVar9);
        Vec_IntPush(p_01,iVar1);
      }
LAB_007153b9:
      lVar9 = lVar9 + 1;
    } while (lVar9 != iVar7);
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  if (fVerbose != 0) {
    iVar7 = p->vCis->nSize;
    printf("Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n",
           (ulong)(uint)p_01->nSize,(ulong)(uint)(iVar7 + p->nObjs + ~(p->vCos->nSize + iVar7)));
  }
  Gia_ManRandom(1);
  Gia_ManRandom(0);
  nSize = p_01->nSize;
  lVar9 = (long)(int)nSize;
  if (0 < lVar9) {
    lVar8 = 0;
    do {
      uVar3 = Gia_ManRandom(0);
      uVar2 = (ulong)(uVar3 >> 1) % (ulong)nSize;
      piVar5 = p_00->pArray;
      iVar7 = piVar5[lVar8];
      piVar5[lVar8] = piVar5[uVar2];
      piVar5[uVar2] = iVar7;
      piVar5 = p_01->pArray;
      iVar7 = piVar5[lVar8];
      piVar5[lVar8] = piVar5[uVar2];
      piVar5[uVar2] = iVar7;
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  if (SelectShift == 0) {
    piVar5 = Abc_QuickSortCost(p_01->pArray,nSize,1);
  }
  else {
    __ptr = (uint *)malloc(0x10);
    uVar3 = 0x10;
    if (0xe < nSize - 1) {
      uVar3 = nSize;
    }
    __ptr[1] = 0;
    *__ptr = uVar3;
    if (uVar3 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)(int)uVar3 << 2);
    }
    *(int **)(__ptr + 2) = piVar5;
    __ptr[1] = nSize;
    if (0 < (int)nSize) {
      lVar8 = 0;
      do {
        piVar5[lVar8] = (int)lVar8;
        lVar8 = lVar8 + 1;
      } while (lVar9 != lVar8);
    }
    __ptr[0] = 0;
    __ptr[1] = 0;
    __ptr[2] = 0;
    __ptr[3] = 0;
    if (*(void **)(__ptr + 2) != (void *)0x0) {
      free(*(void **)(__ptr + 2));
      __ptr[2] = 0;
      __ptr[3] = 0;
    }
    free(__ptr);
  }
  uVar3 = 0x40;
  if ((int)nSize < 0x40) {
    uVar3 = nSize;
  }
  p_02 = (Vec_Int_t *)malloc(0x10);
  uVar6 = 0x10;
  if (0xe < uVar3 - 1) {
    uVar6 = uVar3;
  }
  p_02->nSize = 0;
  p_02->nCap = uVar6;
  if (uVar6 == 0) {
    piVar4 = (int *)0x0;
  }
  else {
    piVar4 = (int *)malloc((long)(int)uVar6 << 2);
  }
  p_02->pArray = piVar4;
  if (0 < (int)nSize) {
    do {
      iVar7 = (int)((long)SelectShift % (long)(int)nSize);
      if (fVerbose != 0) {
        iVar1 = piVar5[iVar7];
        lVar9 = (long)iVar1;
        if (((lVar9 < 0) || (p_00->nSize <= iVar1)) || ((int)nSize <= iVar1)) goto LAB_00715637;
        printf("%2d : Pivot =%7d  Fanout =%7d\n",(long)SelectShift % (long)(int)nSize & 0xffffffff,
               (ulong)(uint)p_00->pArray[lVar9],(ulong)(uint)p_01->pArray[lVar9]);
      }
      iVar7 = piVar5[iVar7];
      if (((long)iVar7 < 0) || (p_00->nSize <= iVar7)) {
LAB_00715637:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Vec_IntPush(p_02,p_00->pArray[iVar7]);
      SelectShift = SelectShift + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  return p_02;
}

Assistant:

Vec_Int_t * Gia_ManFindPivots( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fVerbose )
{
    Vec_Int_t * vPivots, * vWeights;
    Vec_Int_t * vCount, * vResult;
    int i, j, Count, * pPerm, Limit;
/*
    Gia_Obj_t * pObj;
    // count MUX controls
    vCount = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        if ( !Gia_ObjIsMuxType(pObj) ) 
            continue;
        pNodeC = Gia_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
        Vec_IntAddToEntry( vCount, Gia_ObjId(p, Gia_Regular(pNodeC)), 1 );
    }
*/
    // count references
    Gia_ManCreateRefs( p );
    vCount = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) ); p->pRefs = NULL;

    // collect nodes 
    vPivots  = Vec_IntAlloc( 100 );
    vWeights = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCount, Count, i )
    {
        if ( Count < 2 ) continue;
        if ( fOnlyCis && !Gia_ObjIsCi(Gia_ManObj(p, i)) )
            continue;
        Vec_IntPush( vPivots, i );
        Vec_IntPush( vWeights, Count );
    }
    Vec_IntFree( vCount );

    if ( fVerbose )
        printf( "Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n", Vec_IntSize(vWeights), Gia_ManCiNum(p) + Gia_ManAndNum(p) );

    // permute
    Gia_ManRandom(1);
    Gia_ManRandom(0);
    for ( i = 0; i < Vec_IntSize(vWeights); i++ )
    {
        j = (Gia_ManRandom(0) >> 1) % Vec_IntSize(vWeights);
        ABC_SWAP( int, vPivots->pArray[i], vPivots->pArray[j] );
        ABC_SWAP( int, vWeights->pArray[i], vWeights->pArray[j] );
    }
    // sort
    if ( SelectShift == 0 )
        pPerm = Abc_QuickSortCost( Vec_IntArray(vWeights), Vec_IntSize(vWeights), 1 );
    else
    {
        Vec_Int_t * vTemp = Vec_IntStartNatural( Vec_IntSize(vWeights) );
        pPerm = Vec_IntReleaseArray( vTemp );
        Vec_IntFree( vTemp );
    }

    // select    
    Limit = Abc_MinInt( 64, Vec_IntSize(vWeights) );
    vResult = Vec_IntAlloc( Limit );
    for ( i = 0; i < Limit; i++ )
    {
        j = (i + SelectShift) % Vec_IntSize(vWeights);
        if ( fVerbose )
            printf( "%2d : Pivot =%7d  Fanout =%7d\n", j, Vec_IntEntry(vPivots, pPerm[j]), Vec_IntEntry(vWeights, pPerm[j]) );
        Vec_IntPush( vResult, Vec_IntEntry(vPivots, pPerm[j]) );
    }

    Vec_IntFree( vPivots );
    Vec_IntFree( vWeights );
    ABC_FREE( pPerm );

    return vResult;
}